

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O1

void __thiscall
embree::sse2::BVHNSubdivPatch1MBlurBuilderSAH<4>::build(BVHNSubdivPatch1MBlurBuilderSAH<4> *this)

{
  size_t *psVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  BVHN<4> *pBVar4;
  BBox<embree::Vec3fa> *pBVar5;
  char *ptr;
  PrimRefMB *pPVar6;
  MemoryMonitorInterface *pMVar7;
  undefined8 uVar8;
  EVP_PKEY_CTX *pEVar9;
  long *plVar10;
  PrimRefMB *pPVar11;
  BBox<embree::Vec3fa> *pBVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  ulong uVar18;
  EVP_PKEY_CTX *pEVar19;
  size_t sVar20;
  size_t sVar21;
  EVP_PKEY_CTX *pEVar22;
  ulong uVar23;
  size_t numSubPatchesMB;
  size_t numSubPatches;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> pstate;
  ulong local_4cb8;
  double local_4cb0;
  EVP_PKEY_CTX *local_4ca8 [2];
  EVP_PKEY_CTX local_4c98 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4c88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4c78;
  undefined8 local_4c68;
  undefined8 uStack_4c60;
  undefined8 local_4c58;
  undefined8 uStack_4c50;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4c48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c38;
  undefined8 local_4c28;
  undefined8 uStack_4c20;
  undefined8 local_4c18;
  undefined8 uStack_4c10;
  undefined8 local_4848;
  
  if ((this->scene->world).numMBSubdivPatches == 0) {
    sVar20 = (this->primsMB).size_alloced;
    if ((this->primsMB).size_active != 0) {
      (this->primsMB).size_active = 0;
    }
    if ((this->primsMB).size_alloced == sVar20) {
      (this->primsMB).size_active = 0;
    }
    else {
      pPVar6 = (this->primsMB).items;
      if (sVar20 != 0) {
        pMVar7 = (this->primsMB).alloc.device;
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar20 * 0x50,0);
      }
      uVar15 = sVar20 * 0x50;
      if (uVar15 < 0x1c00000) {
        pPVar11 = (PrimRefMB *)alignedMalloc(uVar15,0x10);
      }
      else {
        pPVar11 = (PrimRefMB *)os_malloc(uVar15,&(this->primsMB).alloc.hugepages);
      }
      (this->primsMB).items = pPVar11;
      if ((this->primsMB).size_active != 0) {
        lVar13 = 0x40;
        uVar15 = 0;
        do {
          pPVar11 = (this->primsMB).items;
          puVar2 = (undefined8 *)((long)pPVar6 + lVar13 + -0x40);
          uVar8 = puVar2[1];
          puVar3 = (undefined8 *)((long)pPVar11 + lVar13 + -0x40);
          *puVar3 = *puVar2;
          puVar3[1] = uVar8;
          puVar2 = (undefined8 *)((long)pPVar6 + lVar13 + -0x30);
          uVar8 = puVar2[1];
          puVar3 = (undefined8 *)((long)pPVar11 + lVar13 + -0x30);
          *puVar3 = *puVar2;
          puVar3[1] = uVar8;
          puVar2 = (undefined8 *)((long)pPVar6 + lVar13 + -0x20);
          uVar8 = puVar2[1];
          puVar3 = (undefined8 *)((long)pPVar11 + lVar13 + -0x20);
          *puVar3 = *puVar2;
          puVar3[1] = uVar8;
          puVar2 = (undefined8 *)((long)pPVar6 + lVar13 + -0x10);
          uVar8 = puVar2[1];
          puVar3 = (undefined8 *)((long)pPVar11 + lVar13 + -0x10);
          *puVar3 = *puVar2;
          puVar3[1] = uVar8;
          *(undefined8 *)((long)&(pPVar11->lbounds).bounds0.lower.field_0 + lVar13) =
               *(undefined8 *)((long)&(pPVar6->lbounds).bounds0.lower.field_0 + lVar13);
          uVar15 = uVar15 + 1;
          lVar13 = lVar13 + 0x50;
        } while (uVar15 < (this->primsMB).size_active);
      }
      sVar21 = (this->primsMB).size_alloced;
      if (pPVar6 != (PrimRefMB *)0x0) {
        if (sVar21 * 0x50 < 0x1c00000) {
          alignedFree(pPVar6);
        }
        else {
          os_free(pPVar6,sVar21 * 0x50,(this->primsMB).alloc.hugepages);
        }
      }
      if (sVar21 != 0) {
        pMVar7 = (this->primsMB).alloc.device;
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar21 * -0x50,1);
      }
      (this->primsMB).size_active = 0;
      (this->primsMB).size_alloced = sVar20;
    }
    sVar20 = (this->bounds).size_alloced;
    if ((this->bounds).size_active != 0) {
      (this->bounds).size_active = 0;
    }
    if ((this->bounds).size_alloced == sVar20) {
      (this->bounds).size_active = 0;
    }
    else {
      pBVar5 = (this->bounds).items;
      if (sVar20 != 0) {
        pMVar7 = (this->bounds).alloc.device;
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar20 << 5,0);
      }
      sVar21 = sVar20 << 5;
      if (sVar21 < 0x1c00000) {
        pBVar12 = (BBox<embree::Vec3fa> *)alignedMalloc(sVar21,0x10);
      }
      else {
        pBVar12 = (BBox<embree::Vec3fa> *)os_malloc(sVar21,&(this->bounds).alloc.hugepages);
      }
      (this->bounds).items = pBVar12;
      if ((this->bounds).size_active != 0) {
        lVar13 = 0x10;
        uVar15 = 0;
        do {
          pBVar12 = (this->bounds).items;
          puVar2 = (undefined8 *)((long)pBVar5 + lVar13 + -0x10);
          uVar8 = puVar2[1];
          puVar3 = (undefined8 *)((long)pBVar12 + lVar13 + -0x10);
          *puVar3 = *puVar2;
          puVar3[1] = uVar8;
          puVar2 = (undefined8 *)((long)&(pBVar5->lower).field_0 + lVar13);
          uVar8 = puVar2[1];
          puVar3 = (undefined8 *)((long)&(pBVar12->lower).field_0 + lVar13);
          *puVar3 = *puVar2;
          puVar3[1] = uVar8;
          uVar15 = uVar15 + 1;
          lVar13 = lVar13 + 0x20;
        } while (uVar15 < (this->bounds).size_active);
      }
      sVar21 = (this->bounds).size_alloced;
      if (pBVar5 != (BBox<embree::Vec3fa> *)0x0) {
        if (sVar21 << 5 < 0x1c00000) {
          alignedFree(pBVar5);
        }
        else {
          os_free(pBVar5,sVar21 << 5,(this->bounds).alloc.hugepages);
        }
      }
      if (sVar21 != 0) {
        pMVar7 = (this->bounds).alloc.device;
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar21 * -0x20,1);
      }
      (this->bounds).size_active = 0;
      (this->bounds).size_alloced = sVar20;
    }
    local_4c48._0_8_ = 0x7f8000007f800000;
    local_4c48._8_8_ = 0x7f8000007f800000;
    local_4c38._M_allocated_capacity = 0xff800000ff800000;
    local_4c38._8_8_ = 0xff800000ff800000;
    local_4c28 = 0x7f8000007f800000;
    uStack_4c20 = 0x7f8000007f800000;
    local_4c18 = 0xff800000ff800000;
    uStack_4c10 = 0xff800000ff800000;
    BVHN<4>::set(this->bvh,(NodeRef)0x8,(LBBox3fa *)&local_4c48.field_1,0);
  }
  else {
    pBVar4 = this->bvh;
    local_4ca8[0] = local_4c98;
    std::__cxx11::string::_M_construct((ulong)local_4ca8,'\x01');
    *local_4ca8[0] = (EVP_PKEY_CTX)0x34;
    plVar10 = (long *)std::__cxx11::string::replace((ulong)local_4ca8,0,(char *)0x0,0x1ffdf3e);
    paVar16 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)(plVar10 + 2);
    if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)*plVar10 == paVar16) {
      local_4c78._0_8_ = *(undefined8 *)paVar16;
      local_4c78._8_8_ = plVar10[3];
      local_4c88._0_8_ = &local_4c78;
    }
    else {
      local_4c78._0_8_ = *(undefined8 *)paVar16;
      local_4c88._0_8_ = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)*plVar10;
    }
    local_4c88._8_8_ = plVar10[1];
    *plVar10 = (long)paVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_4c88);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 == paVar17) {
      local_4c38._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_4c38._8_8_ = plVar10[3];
      local_4c48._0_8_ = &local_4c38;
    }
    else {
      local_4c38._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_4c48._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar10;
    }
    local_4c48._8_8_ = plVar10[1];
    *plVar10 = (long)paVar17;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    local_4cb0 = BVHN<4>::preBuild(pBVar4,(string *)&local_4c48.field_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c48._0_8_ != &local_4c38) {
      operator_delete((void *)local_4c48._0_8_);
    }
    if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_4c88._0_8_ != &local_4c78) {
      operator_delete((void *)local_4c88._0_8_);
    }
    if (local_4ca8[0] != local_4c98) {
      operator_delete(local_4ca8[0]);
    }
    local_4848 = 0;
    countSubPatches(this,(size_t *)local_4ca8,&local_4cb8,
                    (ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_>
                     *)&local_4c48.field_1);
    pEVar9 = local_4ca8[0];
    pEVar19 = (EVP_PKEY_CTX *)(this->primsMB).size_alloced;
    pEVar22 = pEVar19;
    if ((pEVar19 < local_4ca8[0]) && (pEVar22 = local_4ca8[0], pEVar19 != (EVP_PKEY_CTX *)0x0)) {
      while (pEVar22 = pEVar19, pEVar22 < local_4ca8[0]) {
        pEVar19 = (EVP_PKEY_CTX *)((long)pEVar22 * 2 + (ulong)((long)pEVar22 * 2 == 0));
      }
    }
    psVar1 = &(this->primsMB).size_active;
    if (local_4ca8[0] < (EVP_PKEY_CTX *)(this->primsMB).size_active) {
      *psVar1 = (size_t)local_4ca8[0];
    }
    if ((EVP_PKEY_CTX *)(this->primsMB).size_alloced == pEVar22) {
      *psVar1 = (size_t)local_4ca8[0];
    }
    else {
      pPVar6 = (this->primsMB).items;
      if (pEVar22 != (EVP_PKEY_CTX *)0x0) {
        pMVar7 = (this->primsMB).alloc.device;
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,(long)pEVar22 * 0x50,0);
      }
      uVar15 = (long)pEVar22 * 0x50;
      if (uVar15 < 0x1c00000) {
        pPVar11 = (PrimRefMB *)alignedMalloc(uVar15,0x10);
      }
      else {
        pPVar11 = (PrimRefMB *)os_malloc(uVar15,&(this->primsMB).alloc.hugepages);
      }
      (this->primsMB).items = pPVar11;
      if ((this->primsMB).size_active != 0) {
        lVar13 = 0x40;
        uVar15 = 0;
        do {
          pPVar11 = (this->primsMB).items;
          puVar2 = (undefined8 *)((long)pPVar6 + lVar13 + -0x40);
          uVar8 = puVar2[1];
          puVar3 = (undefined8 *)((long)pPVar11 + lVar13 + -0x40);
          *puVar3 = *puVar2;
          puVar3[1] = uVar8;
          puVar2 = (undefined8 *)((long)pPVar6 + lVar13 + -0x30);
          uVar8 = puVar2[1];
          puVar3 = (undefined8 *)((long)pPVar11 + lVar13 + -0x30);
          *puVar3 = *puVar2;
          puVar3[1] = uVar8;
          puVar2 = (undefined8 *)((long)pPVar6 + lVar13 + -0x20);
          uVar8 = puVar2[1];
          puVar3 = (undefined8 *)((long)pPVar11 + lVar13 + -0x20);
          *puVar3 = *puVar2;
          puVar3[1] = uVar8;
          puVar2 = (undefined8 *)((long)pPVar6 + lVar13 + -0x10);
          uVar8 = puVar2[1];
          puVar3 = (undefined8 *)((long)pPVar11 + lVar13 + -0x10);
          *puVar3 = *puVar2;
          puVar3[1] = uVar8;
          *(undefined8 *)((long)&(pPVar11->lbounds).bounds0.lower.field_0 + lVar13) =
               *(undefined8 *)((long)&(pPVar6->lbounds).bounds0.lower.field_0 + lVar13);
          uVar15 = uVar15 + 1;
          lVar13 = lVar13 + 0x50;
        } while (uVar15 < (this->primsMB).size_active);
      }
      sVar20 = (this->primsMB).size_alloced;
      if (pPVar6 != (PrimRefMB *)0x0) {
        if (sVar20 * 0x50 < 0x1c00000) {
          alignedFree(pPVar6);
        }
        else {
          os_free(pPVar6,sVar20 * 0x50,(this->primsMB).alloc.hugepages);
        }
      }
      if (sVar20 != 0) {
        pMVar7 = (this->primsMB).alloc.device;
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar20 * -0x50,1);
      }
      (this->primsMB).size_active = (size_t)pEVar9;
      (this->primsMB).size_alloced = (size_t)pEVar22;
    }
    uVar23 = local_4cb8;
    uVar15 = (this->bounds).size_alloced;
    uVar18 = uVar15;
    if ((uVar15 < local_4cb8) && (uVar18 = local_4cb8, uVar15 != 0)) {
      while (uVar18 = uVar15, uVar18 < local_4cb8) {
        uVar15 = uVar18 * 2 + (ulong)(uVar18 * 2 == 0);
      }
    }
    if (local_4cb8 < (this->bounds).size_active) {
      (this->bounds).size_active = local_4cb8;
    }
    if ((this->bounds).size_alloced == uVar18) {
      (this->bounds).size_active = local_4cb8;
    }
    else {
      pBVar5 = (this->bounds).items;
      if (uVar18 != 0) {
        pMVar7 = (this->bounds).alloc.device;
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,uVar18 << 5,0);
      }
      sVar20 = uVar18 << 5;
      if (sVar20 < 0x1c00000) {
        pBVar12 = (BBox<embree::Vec3fa> *)alignedMalloc(sVar20,0x10);
      }
      else {
        pBVar12 = (BBox<embree::Vec3fa> *)os_malloc(sVar20,&(this->bounds).alloc.hugepages);
      }
      (this->bounds).items = pBVar12;
      if ((this->bounds).size_active != 0) {
        lVar13 = 0x10;
        uVar15 = 0;
        do {
          pBVar12 = (this->bounds).items;
          puVar2 = (undefined8 *)((long)pBVar5 + lVar13 + -0x10);
          uVar8 = puVar2[1];
          puVar3 = (undefined8 *)((long)pBVar12 + lVar13 + -0x10);
          *puVar3 = *puVar2;
          puVar3[1] = uVar8;
          puVar2 = (undefined8 *)((long)&(pBVar5->lower).field_0 + lVar13);
          uVar8 = puVar2[1];
          puVar3 = (undefined8 *)((long)&(pBVar12->lower).field_0 + lVar13);
          *puVar3 = *puVar2;
          puVar3[1] = uVar8;
          uVar15 = uVar15 + 1;
          lVar13 = lVar13 + 0x20;
        } while (uVar15 < (this->bounds).size_active);
      }
      sVar20 = (this->bounds).size_alloced;
      if (pBVar5 != (BBox<embree::Vec3fa> *)0x0) {
        if (sVar20 << 5 < 0x1c00000) {
          alignedFree(pBVar5);
        }
        else {
          os_free(pBVar5,sVar20 << 5,(this->bounds).alloc.hugepages);
        }
      }
      if (sVar20 != 0) {
        pMVar7 = (this->bounds).alloc.device;
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar20 * -0x20,1);
      }
      (this->bounds).size_active = uVar23;
      (this->bounds).size_alloced = uVar18;
    }
    pBVar4 = this->bvh;
    if (local_4ca8[0] == (EVP_PKEY_CTX *)0x0) {
      local_4c88._0_8_ = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)0x7f8000007f800000;
      local_4c88._8_8_ = 0x7f8000007f800000;
      local_4c78._0_8_ = -0x7fffff00800000;
      local_4c78._8_8_ = -0x7fffff00800000;
      local_4c68 = 0x7f8000007f800000;
      uStack_4c60 = 0x7f8000007f800000;
      local_4c58 = 0xff800000ff800000;
      uStack_4c50 = 0xff800000ff800000;
      BVHN<4>::set(pBVar4,(NodeRef)0x8,(LBBox3fa *)&local_4c88.field_1,0);
    }
    else {
      uVar18 = local_4cb8 * 0x140;
      uVar15 = (pBVar4->subdiv_patches).size_alloced;
      uVar23 = uVar15;
      if ((uVar15 < uVar18) && (uVar23 = uVar18, uVar15 != 0)) {
        while (uVar23 = uVar15, uVar23 < uVar18) {
          uVar15 = uVar23 * 2 + (ulong)(uVar23 * 2 == 0);
        }
      }
      if (uVar18 < (pBVar4->subdiv_patches).size_active) {
        (pBVar4->subdiv_patches).size_active = uVar18;
      }
      if ((pBVar4->subdiv_patches).size_alloced == uVar23) {
        (pBVar4->subdiv_patches).size_active = uVar18;
      }
      else {
        ptr = (pBVar4->subdiv_patches).items;
        pcVar14 = (char *)alignedMalloc(uVar23,0x20);
        (pBVar4->subdiv_patches).items = pcVar14;
        if ((pBVar4->subdiv_patches).size_active != 0) {
          uVar15 = 0;
          do {
            (pBVar4->subdiv_patches).items[uVar15] = ptr[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar15 < (pBVar4->subdiv_patches).size_active);
        }
        alignedFree(ptr);
        (pBVar4->subdiv_patches).size_active = uVar18;
        (pBVar4->subdiv_patches).size_alloced = uVar23;
      }
      pEVar19 = local_4ca8[0];
      rebuild(this,(size_t)local_4ca8[0],
              (ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *)
              &local_4c48.field_1);
      if ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE) {
        sVar20 = (this->primsMB).size_alloced;
        pPVar6 = (this->primsMB).items;
        if (pPVar6 != (PrimRefMB *)0x0) {
          pEVar19 = (EVP_PKEY_CTX *)(sVar20 * 0x50);
          if (pEVar19 < (EVP_PKEY_CTX *)0x1c00000) {
            alignedFree(pPVar6);
          }
          else {
            os_free(pPVar6,(size_t)pEVar19,(this->primsMB).alloc.hugepages);
          }
        }
        if (sVar20 != 0) {
          pMVar7 = (this->primsMB).alloc.device;
          pEVar19 = (EVP_PKEY_CTX *)(sVar20 * -0x50);
          (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,pEVar19,1);
        }
        *psVar1 = 0;
        (this->primsMB).size_alloced = 0;
        (this->primsMB).items = (PrimRefMB *)0x0;
      }
      BVHN<4>::cleanup(this->bvh,pEVar19);
    }
    BVHN<4>::postBuild(this->bvh,local_4cb0);
  }
  return;
}

Assistant:

void build() 
      {
        /* initialize all half edge structures */
        size_t numPatches = scene->getNumPrimitives(SubdivMesh::geom_type,true);

        /* skip build for empty scene */
        if (numPatches == 0) {
          primsMB.resize(0);
          bounds.resize(0);
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }

        double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "SubdivPatch1MBlurBuilderSAH");

        ParallelForForPrefixSumState<PrimInfoMB> pstate;

        /* calculate number of primitives (some patches need initial subdivision) */
        size_t numSubPatches, numSubPatchesMB;
        countSubPatches(numSubPatches, numSubPatchesMB, pstate);
        primsMB.resize(numSubPatches);
        bounds.resize(numSubPatchesMB);
        
        /* exit if there are no primitives to process */
        if (numSubPatches == 0) {
          bvh->set(BVH::emptyNode,empty,0);
          bvh->postBuild(t0);
          return;
        }
        
        /* Allocate memory for gregory and b-spline patches */
        bvh->subdiv_patches.resize(sizeof(SubdivPatch1) * numSubPatchesMB);

        /* rebuild BVH */
        rebuild(numSubPatches, pstate);
        
	/* clear temporary data for static geometry */
	if (scene->isStaticAccel()) {
          primsMB.clear();
        }
        bvh->cleanup();
        bvh->postBuild(t0);        
      }